

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_permissions.cpp
# Opt level: O2

bool NetWhitelistPermissions::TryParse
               (string *str,NetWhitelistPermissions *output,
               ConnectionDirection *output_connection_direction,bilingual_str *error)

{
  long lVar1;
  string original;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  long in_FS_OFFSET;
  undefined8 uStack_138;
  size_t offset;
  undefined4 uStack_128;
  NetPermissionFlags flags;
  undefined8 local_120 [4];
  bilingual_str local_100;
  bilingual_str local_c0;
  CSubNet subnet;
  string net;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = anon_unknown.dwarf_3c6bc92::TryParsePermissionFlags
                    (str,&flags,output_connection_direction,&offset,error);
  if (bVar2) {
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&net,str,offset,0xffffffffffffffff);
    LookupSubNet(&subnet,&net);
    bVar2 = CSubNet::IsValid(&subnet);
    if (bVar2) {
      (output->super_NetPermissions).m_flags = flags;
      CSubNet::operator=(&output->m_subnet,&subnet);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_120,"",(allocator<char> *)&local_100);
      original._M_string_length = offset;
      original._M_dataplus._M_p = (pointer)uStack_138;
      original.field_2._M_allocated_capacity._0_4_ = uStack_128;
      original.field_2._M_allocated_capacity._4_4_ = flags;
      original.field_2._8_8_ = local_120[0];
      Untranslated(&local_c0,original);
      bilingual_str::operator=(error,&local_c0);
      bilingual_str::~bilingual_str(&local_c0);
      std::__cxx11::string::~string((string *)local_120);
    }
    else {
      _(&local_100,(ConstevalStringLiteral)0xe4ab0e);
      tinyformat::format<std::__cxx11::string>
                (&local_c0,(tinyformat *)&local_100,(bilingual_str *)&net,args);
      bilingual_str::operator=(error,&local_c0);
      bilingual_str::~bilingual_str(&local_c0);
      bilingual_str::~bilingual_str(&local_100);
    }
    prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&subnet);
    std::__cxx11::string::~string((string *)&net);
  }
  else {
    bVar2 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool NetWhitelistPermissions::TryParse(const std::string& str, NetWhitelistPermissions& output, ConnectionDirection& output_connection_direction, bilingual_str& error)
{
    NetPermissionFlags flags;
    size_t offset;
    // Only NetWhitebindPermissions should pass a nullptr for output_connection_direction.
    if (!TryParsePermissionFlags(str, flags, &output_connection_direction, offset, error)) return false;

    const std::string net = str.substr(offset);
    const CSubNet subnet{LookupSubNet(net)};
    if (!subnet.IsValid()) {
        error = strprintf(_("Invalid netmask specified in -whitelist: '%s'"), net);
        return false;
    }

    output.m_flags = flags;
    output.m_subnet = subnet;
    error = Untranslated("");
    return true;
}